

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O3

void __thiscall draco::Options::MergeAndReplace(Options *this,Options *other_options)

{
  mapped_type *pmVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (other_options->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(other_options->options_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->options_,(key_type *)(p_Var2 + 1));
    std::__cxx11::string::_M_assign((string *)pmVar1);
  }
  return;
}

Assistant:

void Options::MergeAndReplace(const Options &other_options) {
  for (const auto &item : other_options.options_) {
    options_[item.first] = item.second;
  }
}